

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
Excel::Parser::loadGlobals
          (Parser *this,vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *boundSheets,
          Stream *stream,IStorage *storage)

{
  Stream *this_00;
  stringstream *this_01;
  Exception *pEVar1;
  void *__buf;
  BiffVersion ver;
  int16_t version;
  Record r;
  short local_222;
  BoundSheet local_220;
  Stream *local_1f8;
  Parser *local_1f0;
  undefined1 local_1e8 [416];
  pointer local_48;
  pointer piStack_40;
  pointer local_38;
  
  this_00 = (Stream *)(local_1e8 + 8);
  this_01 = (stringstream *)(local_1e8 + 0x18);
  ver = UnknownVersion;
  local_1f8 = stream;
  local_1f0 = this;
  do {
    local_1e8._0_2_ = 0;
    local_1e8._4_4_ = 0;
    local_1e8._16_4_ =
         *(undefined4 *)
          &(boundSheets->super__Vector_base<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    local_1e8._8_8_ = &PTR__RecordSubstream_0012cb30;
    std::__cxx11::stringstream::stringstream(this_01);
    local_48 = (pointer)0x0;
    piStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    Record::read((Record *)local_1e8,(int)boundSheets,__buf,(size_t)storage);
    if ((ushort)local_1e8._0_2_ < 0xfc) {
      if ((ushort)local_1e8._0_2_ < 0x2f) {
        if (local_1e8._0_2_ == 0x22) {
          local_220._0_8_ = (ulong)(uint6)local_220._2_6_ << 0x10;
          Stream::read<unsigned_short>(this_00,(unsigned_short *)&local_220,2);
          (*local_1f8->_vptr_Stream[3])(local_1f8,local_220._0_8_ & 0xffff);
        }
        else if (local_1e8._0_2_ == 10) {
          if (local_48 != (pointer)0x0) {
            operator_delete(local_48,(long)local_38 - (long)local_48);
          }
          local_1e8._8_8_ = &PTR__RecordSubstream_0012cb30;
          std::__cxx11::stringstream::~stringstream(this_01);
          std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x98));
          return;
        }
      }
      else if (local_1e8._0_2_ == 0x85) {
        parseBoundSheet(&local_220,(Record *)local_1e8,ver);
        std::vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>::
        emplace_back<Excel::BoundSheet>
                  ((vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *)local_1f0,
                   &local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_220.m_sheetName._M_dataplus._M_p != &local_220.m_sheetName.field_2) {
          operator_delete(local_220.m_sheetName._M_dataplus._M_p,
                          local_220.m_sheetName.field_2._M_allocated_capacity * 4 + 4);
        }
      }
      else if (local_1e8._0_2_ == 0x2f) {
        pEVar1 = (Exception *)__cxa_allocate_exception(0x30);
        local_220._0_8_ = (long)&local_220 + 0x10;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_220,
                   L"This file is protected. Decryption is not implemented yet.",L"");
        Exception::Exception(pEVar1,(wstring *)&local_220);
        __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
      }
    }
    else if (local_1e8._0_2_ == 0xfc) {
      parseSST((Record *)local_1e8,(IStorage *)local_1f8);
    }
    else if (local_1e8._0_2_ == 0x809) {
      local_220._0_8_ = (ulong)(uint6)local_220._2_6_ << 0x10;
      local_222 = 0;
      Stream::read<short>(this_00,(short *)&local_220,2);
      Stream::read<short>(this_00,&local_222,2);
      ver = UnknownVersion;
      if ((unsigned_short)local_220.m_BOFPosition == 0x500) {
        ver = BIFF7;
      }
      if ((unsigned_short)local_220.m_BOFPosition == 0x600) {
        ver = BIFF8;
      }
    }
    else if (local_1e8._0_2_ == 0xffff) {
      pEVar1 = (Exception *)__cxa_allocate_exception(0x30);
      local_220._0_8_ = (long)&local_220 + 0x10;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)&local_220,L"Wrong format.",L"");
      Exception::Exception(pEVar1,(wstring *)&local_220);
      __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
    }
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
    local_1e8._8_8_ = &PTR__RecordSubstream_0012cb30;
    std::__cxx11::stringstream::~stringstream(this_01);
    std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x98));
  } while( true );
}

Assistant:

inline void
Parser::loadGlobals( std::vector< BoundSheet > & boundSheets, 
	Stream & stream, IStorage & storage )
{
	BOF bof;

	while( true )
	{
		Record r( stream );

		switch( r.code() )
		{
			case XL_BOF :
				bof.parse( r );
				break;

			case XL_FILEPASS :
				throw Exception( L"This file is protected. Decryption is not implemented yet." );

			case XL_SST :
				parseSST( r, storage );
				break;

			case XL_BOUNDSHEET :
				boundSheets.push_back( parseBoundSheet( r, bof.version() ) );
				break;

			case XL_DATEMODE :
				handleDateMode( r, storage );
				break;

			case XL_EOF :
				return;

			case XL_UNKNOWN :
				throw Exception( L"Wrong format." );

			default:
				break;
		}
	}
}